

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BFGS.cpp
# Opt level: O0

DynamicVector<double,_std::allocator<double>_> * __thiscall
QuantLib::BFGS::getUpdatedDirection
          (BFGS *this,Problem *P,RealType param_3,
          DynamicVector<double,_std::allocator<double>_> *oldGradient)

{
  double dVar1;
  uint uVar2;
  size_type sVar3;
  double *pdVar4;
  reference pvVar5;
  const_reference pvVar6;
  Problem *in_RDX;
  long in_RSI;
  DynamicVector<double,_std::allocator<double>_> *in_RDI;
  double dVar7;
  size_t j_2;
  size_t i_5;
  size_t j_1;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  double sumxi;
  double sumdg;
  double fad;
  double fae;
  double fac;
  size_t j;
  size_t i_1;
  DynamicVector<double,_std::allocator<double>_> diffGradientWithHessianApplied;
  DynamicVector<double,_std::allocator<double>_> diffGradient;
  size_t i;
  DynamicVector<double,_std::allocator<double>_> *direction;
  allocator_type *in_stack_fffffffffffffc48;
  DynamicVector<double,_std::allocator<double>_> *in_stack_fffffffffffffc50;
  size_type in_stack_fffffffffffffc58;
  DynamicRectMatrix<double> *in_stack_fffffffffffffc60;
  DynamicRectMatrix<double> *in_stack_fffffffffffffc70;
  DynamicRectMatrix<double> *in_stack_fffffffffffffc78;
  ulong uVar8;
  DynamicVector<double,_std::allocator<double>_> *in_stack_fffffffffffffc80;
  DynamicVector<double,_std::allocator<double>_> *in_stack_fffffffffffffc88;
  ulong local_130;
  ulong local_128;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  double local_f8;
  double local_f0;
  double local_e0;
  double local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_60;
  
  uVar2 = OpenMD::DynamicRectMatrix<double>::getNRow((DynamicRectMatrix<double> *)(in_RSI + 0x10));
  if (uVar2 == 0) {
    Problem::currentValue(in_RDX);
    OpenMD::DynamicVector<double,_std::allocator<double>_>::size
              ((DynamicVector<double,_std::allocator<double>_> *)0x25fa1a);
    Problem::currentValue(in_RDX);
    OpenMD::DynamicVector<double,_std::allocator<double>_>::size
              ((DynamicVector<double,_std::allocator<double>_> *)0x25fa36);
    OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
              (in_stack_fffffffffffffc60,(uint)(in_stack_fffffffffffffc58 >> 0x20),
               (uint)in_stack_fffffffffffffc58,(double)in_stack_fffffffffffffc50);
    OpenMD::DynamicRectMatrix<double>::operator=
              (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    OpenMD::DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x25fa87);
    OpenMD::DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x25fa94);
    local_60 = 0;
    while( true ) {
      Problem::currentValue(in_RDX);
      sVar3 = OpenMD::DynamicVector<double,_std::allocator<double>_>::size
                        ((DynamicVector<double,_std::allocator<double>_> *)0x25fac5);
      if (sVar3 <= local_60) break;
      pdVar4 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RSI + 0x10),(uint)local_60,(uint)local_60
                         );
      *pdVar4 = 1.0;
      local_60 = local_60 + 1;
    }
  }
  std::allocator<double>::allocator((allocator<double> *)0x25fb59);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  std::allocator<double>::~allocator((allocator<double> *)0x25fb7d);
  Problem::currentValue(in_RDX);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::size
            ((DynamicVector<double,_std::allocator<double>_> *)0x25fba1);
  std::allocator<double>::allocator((allocator<double> *)0x25fbca);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc60,
             in_stack_fffffffffffffc58,(value_type_conflict2 *)in_stack_fffffffffffffc50,
             in_stack_fffffffffffffc48);
  std::allocator<double>::~allocator((allocator<double> *)0x25fbfe);
  LineSearch::lastGradient(*(LineSearch **)(in_RSI + 8));
  OpenMD::operator-(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffc50,
             (DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc48);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x25fc5a);
  local_c8 = 0;
  while( true ) {
    Problem::currentValue(in_RDX);
    sVar3 = OpenMD::DynamicVector<double,_std::allocator<double>_>::size
                      ((DynamicVector<double,_std::allocator<double>_> *)0x25fc9a);
    if (sVar3 <= local_c8) break;
    local_d0 = 0;
    while( true ) {
      Problem::currentValue(in_RDX);
      sVar3 = OpenMD::DynamicVector<double,_std::allocator<double>_>::size
                        ((DynamicVector<double,_std::allocator<double>_> *)0x25fcee);
      if (sVar3 <= local_d0) break;
      pdVar4 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RSI + 0x10),(uint)local_c8,(uint)local_d0
                         );
      dVar7 = *pdVar4;
      pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                         (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
      dVar1 = *pvVar5;
      pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                         (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
      *pvVar5 = dVar7 * dVar1 + *pvVar5;
      local_d0 = local_d0 + 1;
    }
    local_c8 = local_c8 + 1;
  }
  local_f8 = 0.0;
  local_f0 = 0.0;
  local_e0 = 0.0;
  local_d8 = 0.0;
  local_100 = 0;
  while( true ) {
    Problem::currentValue(in_RDX);
    sVar3 = OpenMD::DynamicVector<double,_std::allocator<double>_>::size
                      ((DynamicVector<double,_std::allocator<double>_> *)0x25fedf);
    if (sVar3 <= local_100) break;
    pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
    dVar7 = *pvVar5;
    LineSearch::searchDirection(*(LineSearch **)(in_RSI + 8));
    pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
    local_d8 = dVar7 * *pvVar5 + local_d8;
    pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
    dVar7 = *pvVar5;
    pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
    local_e0 = dVar7 * *pvVar5 + local_e0;
    pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
    dVar7 = pow(*pvVar5,2.0);
    local_f0 = local_f0 + dVar7;
    LineSearch::searchDirection(*(LineSearch **)(in_RSI + 8));
    pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
    dVar7 = pow(*pvVar5,2.0);
    local_f8 = dVar7 + local_f8;
    local_100 = local_100 + 1;
  }
  dVar7 = sqrt(local_f0 * 1e-08 * local_f8);
  if (dVar7 < local_d8) {
    local_108 = 0;
    while( true ) {
      Problem::currentValue(in_RDX);
      sVar3 = OpenMD::DynamicVector<double,_std::allocator<double>_>::size
                        ((DynamicVector<double,_std::allocator<double>_> *)0x26019c);
      if (sVar3 <= local_108) break;
      LineSearch::searchDirection(*(LineSearch **)(in_RSI + 8));
      pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                         (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
      dVar7 = *pvVar5;
      pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                         (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
      dVar1 = *pvVar5;
      pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                         (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
      *pvVar5 = (1.0 / local_d8) * dVar7 - (1.0 / local_e0) * dVar1;
      local_108 = local_108 + 1;
    }
    local_110 = 0;
    while( true ) {
      Problem::currentValue(in_RDX);
      sVar3 = OpenMD::DynamicVector<double,_std::allocator<double>_>::size
                        ((DynamicVector<double,_std::allocator<double>_> *)0x26030b);
      if (sVar3 <= local_110) break;
      local_118 = 0;
      while( true ) {
        Problem::currentValue(in_RDX);
        sVar3 = OpenMD::DynamicVector<double,_std::allocator<double>_>::size
                          ((DynamicVector<double,_std::allocator<double>_> *)0x26035f);
        if (sVar3 <= local_118) break;
        LineSearch::searchDirection(*(LineSearch **)(in_RSI + 8));
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                           (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
        dVar7 = *pvVar5;
        LineSearch::searchDirection(*(LineSearch **)(in_RSI + 8));
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                           (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
        dVar1 = *pvVar5;
        pdVar4 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RSI + 0x10),(uint)local_110,
                            (uint)local_118);
        *pdVar4 = (1.0 / local_d8) * dVar7 * dVar1 + *pdVar4;
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                           (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
        dVar7 = *pvVar5;
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                           (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
        dVar1 = *pvVar5;
        pdVar4 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RSI + 0x10),(uint)local_110,
                            (uint)local_118);
        *pdVar4 = *pdVar4 - (1.0 / local_e0) * dVar7 * dVar1;
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                           (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
        dVar7 = *pvVar5;
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                           (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
        dVar1 = *pvVar5;
        pdVar4 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RSI + 0x10),(uint)local_110,
                            (uint)local_118);
        *pdVar4 = local_e0 * dVar7 * dVar1 + *pdVar4;
        local_118 = local_118 + 1;
      }
      local_110 = local_110 + 1;
    }
  }
  Problem::currentValue(in_RDX);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::size
            ((DynamicVector<double,_std::allocator<double>_> *)0x260687);
  std::allocator<double>::allocator((allocator<double> *)0x26069e);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48,
             (allocator_type *)0x2606b5);
  std::allocator<double>::~allocator((allocator<double> *)0x2606c4);
  local_128 = 0;
  while( true ) {
    Problem::currentValue(in_RDX);
    sVar3 = OpenMD::DynamicVector<double,_std::allocator<double>_>::size
                      ((DynamicVector<double,_std::allocator<double>_> *)0x2606fb);
    if (sVar3 <= local_128) break;
    pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
    *pvVar5 = 0.0;
    local_130 = 0;
    while( true ) {
      uVar8 = local_130;
      Problem::currentValue(in_RDX);
      sVar3 = OpenMD::DynamicVector<double,_std::allocator<double>_>::size
                        ((DynamicVector<double,_std::allocator<double>_> *)0x26076b);
      if (sVar3 <= uVar8) break;
      pdVar4 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RSI + 0x10),(uint)local_128,
                          (uint)local_130);
      dVar7 = *pdVar4;
      LineSearch::lastGradient(*(LineSearch **)(in_RSI + 8));
      pvVar6 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                         (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
      in_stack_fffffffffffffc48 = (allocator_type *)*pvVar6;
      in_stack_fffffffffffffc50 =
           (DynamicVector<double,_std::allocator<double>_> *)
           OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                     (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
      (in_stack_fffffffffffffc50->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl
      .super__Vector_impl_data._M_start =
           (pointer)(-dVar7 * (double)in_stack_fffffffffffffc48 +
                    (double)(in_stack_fffffffffffffc50->data_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
      local_130 = local_130 + 1;
    }
    local_128 = local_128 + 1;
  }
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x2608ec);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x2608f9);
  return in_RDI;
}

Assistant:

DynamicVector<RealType> BFGS::getUpdatedDirection(
      const Problem& P, RealType, const DynamicVector<RealType>& oldGradient) {
    if (inverseHessian_.getNRow() == 0) {
      // first time in this update, we create needed structures
      inverseHessian_ = DynamicRectMatrix<RealType>(
          P.currentValue().size(), P.currentValue().size(), 0.);
      for (size_t i = 0; i < P.currentValue().size(); ++i)
        inverseHessian_(i, i) = 1.;
    }

    DynamicVector<RealType> diffGradient;
    DynamicVector<RealType> diffGradientWithHessianApplied(
        P.currentValue().size(), 0.);

    diffGradient = lineSearch_->lastGradient() - oldGradient;
    for (size_t i = 0; i < P.currentValue().size(); ++i)
      for (size_t j = 0; j < P.currentValue().size(); ++j)
        diffGradientWithHessianApplied[i] +=
            inverseHessian_(i, j) * diffGradient[j];

    double fac, fae, fad;
    double sumdg, sumxi;

    fac = fae = sumdg = sumxi = 0.;
    for (size_t i = 0; i < P.currentValue().size(); ++i) {
      fac += diffGradient[i] * lineSearch_->searchDirection()[i];
      fae += diffGradient[i] * diffGradientWithHessianApplied[i];
      sumdg += std::pow(diffGradient[i], 2.);
      sumxi += std::pow(lineSearch_->searchDirection()[i], 2.);
    }

    if (fac > std::sqrt(1e-8 * sumdg *
                        sumxi))  // skip update if fac not sufficiently positive
    {
      fac = 1.0 / fac;
      fad = 1.0 / fae;

      for (size_t i = 0; i < P.currentValue().size(); ++i)
        diffGradient[i] = fac * lineSearch_->searchDirection()[i] -
                          fad * diffGradientWithHessianApplied[i];

      for (size_t i = 0; i < P.currentValue().size(); ++i)
        for (size_t j = 0; j < P.currentValue().size(); ++j) {
          inverseHessian_(i, j) += fac * lineSearch_->searchDirection()[i] *
                                   lineSearch_->searchDirection()[j];
          inverseHessian_(i, j) -= fad * diffGradientWithHessianApplied[i] *
                                   diffGradientWithHessianApplied[j];
          inverseHessian_(i, j) += fae * diffGradient[i] * diffGradient[j];
        }
    }
    // else
    //  throw "BFGS: FAC not sufficiently positive";

    DynamicVector<RealType> direction(P.currentValue().size());
    for (size_t i = 0; i < P.currentValue().size(); ++i) {
      direction[i] = 0.0;
      for (size_t j = 0; j < P.currentValue().size(); ++j)
        direction[i] -= inverseHessian_(i, j) * lineSearch_->lastGradient()[j];
    }

    return direction;
  }